

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

int cuddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  int local_5c;
  int local_54;
  uint local_4c;
  int local_48;
  int initialSize;
  int classes;
  int symgroups;
  int symvars;
  int result;
  int x;
  int size;
  int *var;
  int local_20;
  int i;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  local_4c = table->keys - table->isolated;
  result = table->size;
  _x = (void *)0x0;
  local_20 = upper;
  i = lower;
  _upper_local = table;
  entry = (int *)malloc((long)result << 2);
  if (entry == (int *)0x0) {
    _upper_local->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    _x = malloc((long)result << 2);
    if (_x == (void *)0x0) {
      _upper_local->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      for (var._4_4_ = 0; (int)var._4_4_ < result; var._4_4_ = var._4_4_ + 1) {
        symvars = _upper_local->perm[(int)var._4_4_];
        entry[(int)var._4_4_] = _upper_local->subtables[symvars].keys;
        *(uint *)((long)_x + (long)(int)var._4_4_ * 4) = var._4_4_;
      }
      qsort(_x,(long)result,4,ddSymmUniqueCompare);
      for (var._4_4_ = i; (int)var._4_4_ <= local_20; var._4_4_ = var._4_4_ + 1) {
        _upper_local->subtables[(int)var._4_4_].next = var._4_4_;
      }
      var._4_4_ = 0;
      while( true ) {
        if (_upper_local->size < _upper_local->siftMaxVar) {
          local_54 = _upper_local->size;
        }
        else {
          local_54 = _upper_local->siftMaxVar;
        }
        if ((local_54 <= (int)var._4_4_) || (_upper_local->siftMaxSwap <= ddTotalNumberSwapping)) {
          do {
            if (local_4c <= _upper_local->keys - _upper_local->isolated) {
              ddSymmSummary(_upper_local,i,local_20,&classes,&initialSize);
              if (_x != (void *)0x0) {
                free(_x);
                _x = (void *)0x0;
              }
              if (entry != (int *)0x0) {
                free(entry);
                entry = (int *)0x0;
              }
              return classes + 1;
            }
            local_4c = _upper_local->keys - _upper_local->isolated;
            local_48 = 0;
            for (symvars = i; symvars <= local_20; symvars = symvars + 1) {
              for (; (uint)symvars < _upper_local->subtables[symvars].next;
                  symvars = _upper_local->subtables[symvars].next) {
              }
              var._4_4_ = _upper_local->invperm[symvars];
              entry[(int)var._4_4_] = _upper_local->subtables[symvars].keys;
              *(uint *)((long)_x + (long)local_48 * 4) = var._4_4_;
              local_48 = local_48 + 1;
            }
            qsort(_x,(long)local_48,4,ddSymmUniqueCompare);
            var._4_4_ = 0;
            while( true ) {
              if (local_48 < _upper_local->siftMaxVar) {
                local_5c = local_48;
              }
              else {
                local_5c = _upper_local->siftMaxVar;
              }
              if ((local_5c <= (int)var._4_4_) ||
                 (_upper_local->siftMaxSwap <= ddTotalNumberSwapping)) break;
              symvars = _upper_local->perm[*(int *)((long)_x + (long)(int)var._4_4_ * 4)];
              if ((_upper_local->subtables[symvars].next <= (uint)symvars) &&
                 (symgroups = ddSymmSiftingConvAux(_upper_local,symvars,i,local_20), symgroups == 0)
                 ) {
                symgroups = 0;
                goto LAB_00a29580;
              }
              var._4_4_ = var._4_4_ + 1;
            }
          } while( true );
        }
        symvars = _upper_local->perm[*(int *)((long)_x + (long)(int)var._4_4_ * 4)];
        if ((((i <= symvars) && (symvars <= local_20)) &&
            (_upper_local->subtables[symvars].next == symvars)) &&
           (symgroups = ddSymmSiftingAux(_upper_local,symvars,i,local_20), symgroups == 0)) break;
        var._4_4_ = var._4_4_ + 1;
      }
      symgroups = 0;
    }
  }
LAB_00a29580:
  if ((entry != (int *)0x0) && (entry != (int *)0x0)) {
    free(entry);
    entry = (int *)0x0;
  }
  if ((_x != (void *)0x0) && (_x != (void *)0x0)) {
    free(_x);
  }
  return 0;
}

Assistant:

int
cuddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         initialSize;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keys - table->isolated;

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar, table->size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->perm[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtables[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keys - table->isolated;
#endif
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+");
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keys - table->isolated) {
        initialSize = table->keys - table->isolated;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtables[x].next) {
                x = table->subtables[x].next;
            }
            /* Here x is the largest index in a group.
            ** Groups consist of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invperm[x];
            entry[i] = table->subtables[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

        /* Now sift. */
        for (i = 0; i < ddMin(table->siftMaxVar,classes); i++) {
            if (ddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->perm[var[i]];
            if ((unsigned) x >= table->subtables[x].next) {
#ifdef DD_STATS
                previousSize = table->keys - table->isolated;
#endif
                result = ddSymmSiftingConvAux(table,x,lower,upper);
                if (!result ) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keys < (unsigned) previousSize + table->isolated) {
                    (void) fprintf(table->out,"-");
                } else if (table->keys > (unsigned) previousSize +
                           table->isolated) {
                    (void) fprintf(table->out,"+");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(entry);

    return(1+symvars);

ddSymmSiftingConvOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}